

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileCommand.cxx
# Opt level: O0

bool anon_unknown.dwarf_a7919c::HandleDifferentCommand
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *args,cmExecutionStatus *status)

{
  char *pcVar1;
  char *this;
  bool bVar2;
  ulong uVar3;
  size_type sVar4;
  const_reference pvVar5;
  cmMakefile *this_00;
  char *local_228;
  string_view local_1b0;
  allocator<char> local_199;
  string local_198;
  allocator<char> local_171;
  string local_170;
  allocator<char> local_149;
  string local_148;
  char *local_128;
  char *result;
  string local_118;
  allocator<char> local_f1;
  string local_f0;
  cmAlphaNum local_c0;
  cmAlphaNum local_90;
  string local_60;
  uint local_40;
  int local_3c;
  uint i;
  Doing doing;
  char *var;
  char *file_rhs;
  char *file_lhs;
  cmExecutionStatus *status_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *args_local;
  
  file_rhs = (char *)0x0;
  var = (char *)0x0;
  _i = (char *)0x0;
  local_3c = 1;
  local_40 = 1;
  file_lhs = (char *)status;
  status_local = (cmExecutionStatus *)args;
  do {
    uVar3 = (ulong)local_40;
    sVar4 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)status_local);
    this = file_lhs;
    pcVar1 = file_rhs;
    if (sVar4 <= uVar3) {
      if (_i == (char *)0x0) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_f0,"DIFFERENT not given result variable name.",&local_f1);
        cmExecutionStatus::SetError((cmExecutionStatus *)this,&local_f0);
        std::__cxx11::string::~string((string *)&local_f0);
        std::allocator<char>::~allocator(&local_f1);
        args_local._7_1_ = false;
      }
      else if ((file_rhs == (char *)0x0) || (var == (char *)0x0)) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_118,"DIFFERENT not given FILES option with two file names.",
                   (allocator<char> *)((long)&result + 7));
        cmExecutionStatus::SetError((cmExecutionStatus *)this,&local_118);
        std::__cxx11::string::~string((string *)&local_118);
        std::allocator<char>::~allocator((allocator<char> *)((long)&result + 7));
        args_local._7_1_ = false;
      }
      else {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_148,pcVar1,&local_149);
        pcVar1 = var;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_170,pcVar1,&local_171);
        bVar2 = cmsys::SystemTools::FilesDiffer(&local_148,&local_170);
        if (bVar2) {
          local_228 = "1";
        }
        else {
          local_228 = "0";
        }
        std::__cxx11::string::~string((string *)&local_170);
        std::allocator<char>::~allocator(&local_171);
        std::__cxx11::string::~string((string *)&local_148);
        std::allocator<char>::~allocator(&local_149);
        local_128 = local_228;
        this_00 = cmExecutionStatus::GetMakefile((cmExecutionStatus *)file_lhs);
        pcVar1 = _i;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_198,pcVar1,&local_199);
        std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                  (&local_1b0,local_128);
        cmMakefile::AddDefinition(this_00,&local_198,local_1b0);
        std::__cxx11::string::~string((string *)&local_198);
        std::allocator<char>::~allocator(&local_199);
        args_local._7_1_ = true;
      }
      return args_local._7_1_;
    }
    pvVar5 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)status_local,(ulong)local_40);
    bVar2 = std::operator==(pvVar5,"FILES");
    pcVar1 = file_lhs;
    if (bVar2) {
      local_3c = 2;
    }
    else if (local_3c == 1) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)status_local,(ulong)local_40);
      _i = (char *)std::__cxx11::string::c_str();
      local_3c = 0;
    }
    else if (local_3c == 2) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)status_local,(ulong)local_40);
      file_rhs = (char *)std::__cxx11::string::c_str();
      local_3c = 3;
    }
    else {
      if (local_3c != 3) {
        cmAlphaNum::cmAlphaNum(&local_90,"DIFFERENT given unknown argument ");
        pvVar5 = std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               *)status_local,(ulong)local_40);
        cmAlphaNum::cmAlphaNum(&local_c0,pvVar5);
        cmStrCat<>(&local_60,&local_90,&local_c0);
        cmExecutionStatus::SetError((cmExecutionStatus *)pcVar1,&local_60);
        std::__cxx11::string::~string((string *)&local_60);
        return false;
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)status_local,(ulong)local_40);
      var = (char *)std::__cxx11::string::c_str();
      local_3c = 0;
    }
    local_40 = local_40 + 1;
  } while( true );
}

Assistant:

bool HandleDifferentCommand(std::vector<std::string> const& args,
                            cmExecutionStatus& status)
{
  /*
    FILE(DIFFERENT <variable> FILES <lhs> <rhs>)
   */

  // Evaluate arguments.
  const char* file_lhs = nullptr;
  const char* file_rhs = nullptr;
  const char* var = nullptr;
  enum Doing
  {
    DoingNone,
    DoingVar,
    DoingFileLHS,
    DoingFileRHS
  };
  Doing doing = DoingVar;
  for (unsigned int i = 1; i < args.size(); ++i) {
    if (args[i] == "FILES") {
      doing = DoingFileLHS;
    } else if (doing == DoingVar) {
      var = args[i].c_str();
      doing = DoingNone;
    } else if (doing == DoingFileLHS) {
      file_lhs = args[i].c_str();
      doing = DoingFileRHS;
    } else if (doing == DoingFileRHS) {
      file_rhs = args[i].c_str();
      doing = DoingNone;
    } else {
      status.SetError(cmStrCat("DIFFERENT given unknown argument ", args[i]));
      return false;
    }
  }
  if (!var) {
    status.SetError("DIFFERENT not given result variable name.");
    return false;
  }
  if (!file_lhs || !file_rhs) {
    status.SetError("DIFFERENT not given FILES option with two file names.");
    return false;
  }

  // Compare the files.
  const char* result =
    cmSystemTools::FilesDiffer(file_lhs, file_rhs) ? "1" : "0";
  status.GetMakefile().AddDefinition(var, result);
  return true;
}